

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statGet(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Stat4Sample *pSVar1;
  int iVar2;
  Stat4Accum *p_00;
  char *pcVar3;
  ulong uVar4;
  char *local_80;
  char *z_1;
  int i_1;
  char *zRet_1;
  tRowcnt *aCnt;
  Stat4Sample *pS;
  u64 iVal;
  u64 nDistinct;
  char *zRet;
  char *pcStack_38;
  int i;
  char *z;
  int eCall;
  Stat4Accum *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  p_00 = (Stat4Accum *)sqlite3_value_blob(*argv);
  iVar2 = sqlite3_value_int(argv[1]);
  if (iVar2 == 0) {
    pcVar3 = (char *)sqlite3MallocZero((long)((p_00->nKeyCol + 1) * 0x19));
    if (pcVar3 == (char *)0x0) {
      sqlite3_result_error_nomem(context);
    }
    else {
      sqlite3_snprintf(0x18,pcVar3,"%llu",(ulong)p_00->nRow);
      iVar2 = sqlite3Strlen30(pcVar3);
      pcStack_38 = pcVar3 + iVar2;
      for (zRet._4_4_ = 0; zRet._4_4_ < p_00->nKeyCol; zRet._4_4_ = zRet._4_4_ + 1) {
        uVar4 = (ulong)((p_00->current).anDLt[zRet._4_4_] + 1);
        sqlite3_snprintf(0x18,pcStack_38," %llu",((p_00->nRow + uVar4) - 1) / uVar4);
        iVar2 = sqlite3Strlen30(pcStack_38);
        pcStack_38 = pcStack_38 + iVar2;
      }
      sqlite3_result_text(context,pcVar3,-1,sqlite3_free);
    }
  }
  else if (iVar2 == 1) {
    if (p_00->iGet < 0) {
      samplePushPrevious(p_00,0);
      p_00->iGet = 0;
    }
    if (p_00->iGet < p_00->nSample) {
      pSVar1 = p_00->a;
      iVar2 = p_00->iGet;
      if (pSVar1[iVar2].nRowid == 0) {
        sqlite3_result_int64(context,pSVar1[iVar2].u.iRowid);
      }
      else {
        sqlite3_result_blob(context,pSVar1[iVar2].u.aRowid,pSVar1[iVar2].nRowid,
                            (_func_void_void_ptr *)0xffffffffffffffff);
      }
    }
  }
  else {
    if (iVar2 == 2) {
      zRet_1 = (char *)p_00->a[p_00->iGet].anEq;
    }
    else if (iVar2 == 3) {
      zRet_1 = (char *)p_00->a[p_00->iGet].anLt;
    }
    else {
      zRet_1 = (char *)p_00->a[p_00->iGet].anDLt;
      p_00->iGet = p_00->iGet + 1;
    }
    pcVar3 = (char *)sqlite3MallocZero((long)(p_00->nCol * 0x19));
    if (pcVar3 == (char *)0x0) {
      sqlite3_result_error_nomem(context);
    }
    else {
      local_80 = pcVar3;
      for (z_1._4_4_ = 0; z_1._4_4_ < p_00->nCol; z_1._4_4_ = z_1._4_4_ + 1) {
        sqlite3_snprintf(0x18,local_80,"%llu ",(ulong)*(uint *)(zRet_1 + (long)z_1._4_4_ * 4));
        iVar2 = sqlite3Strlen30(local_80);
        local_80 = local_80 + iVar2;
      }
      local_80[-1] = '\0';
      sqlite3_result_text(context,pcVar3,-1,sqlite3_free);
    }
  }
  return;
}

Assistant:

static void statGet(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* STAT3 and STAT4 have a parameter on this routine. */
  int eCall = sqlite3_value_int(argv[1]);
  assert( argc==2 );
  assert( eCall==STAT_GET_STAT1 || eCall==STAT_GET_NEQ 
       || eCall==STAT_GET_ROWID || eCall==STAT_GET_NLT
       || eCall==STAT_GET_NDLT 
  );
  if( eCall==STAT_GET_STAT1 )
#else
  assert( argc==1 );
#endif
  {
    /* Return the value to store in the "stat" column of the sqlite_stat1
    ** table for this index.
    **
    ** The value is a string composed of a list of integers describing 
    ** the index. The first integer in the list is the total number of 
    ** entries in the index. There is one additional integer in the list 
    ** for each indexed column. This additional integer is an estimate of
    ** the number of rows matched by a stabbing query on the index using
    ** a key with the corresponding number of fields. In other words,
    ** if the index is on columns (a,b) and the sqlite_stat1 value is 
    ** "100 10 2", then SQLite estimates that:
    **
    **   * the index contains 100 rows,
    **   * "WHERE a=?" matches 10 rows, and
    **   * "WHERE a=? AND b=?" matches 2 rows.
    **
    ** If D is the count of distinct values and K is the total number of 
    ** rows, then each estimate is computed as:
    **
    **        I = (K+D-1)/D
    */
    char *z;
    int i;

    char *zRet = sqlite3MallocZero( (p->nKeyCol+1)*25 );
    if( zRet==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }

    sqlite3_snprintf(24, zRet, "%llu", (u64)p->nRow);
    z = zRet + sqlite3Strlen30(zRet);
    for(i=0; i<p->nKeyCol; i++){
      u64 nDistinct = p->current.anDLt[i] + 1;
      u64 iVal = (p->nRow + nDistinct - 1) / nDistinct;
      sqlite3_snprintf(24, z, " %llu", iVal);
      z += sqlite3Strlen30(z);
      assert( p->current.anEq[i] );
    }
    assert( z[0]=='\0' && z>zRet );

    sqlite3_result_text(context, zRet, -1, sqlite3_free);
  }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( eCall==STAT_GET_ROWID ){
    if( p->iGet<0 ){
      samplePushPrevious(p, 0);
      p->iGet = 0;
    }
    if( p->iGet<p->nSample ){
      Stat4Sample *pS = p->a + p->iGet;
      if( pS->nRowid==0 ){
        sqlite3_result_int64(context, pS->u.iRowid);
      }else{
        sqlite3_result_blob(context, pS->u.aRowid, pS->nRowid,
                            SQLITE_TRANSIENT);
      }
    }
  }else{
    tRowcnt *aCnt = 0;

    assert( p->iGet<p->nSample );
    switch( eCall ){
      case STAT_GET_NEQ:  aCnt = p->a[p->iGet].anEq; break;
      case STAT_GET_NLT:  aCnt = p->a[p->iGet].anLt; break;
      default: {
        aCnt = p->a[p->iGet].anDLt; 
        p->iGet++;
        break;
      }
    }

    if( IsStat3 ){
      sqlite3_result_int64(context, (i64)aCnt[0]);
    }else{
      char *zRet = sqlite3MallocZero(p->nCol * 25);
      if( zRet==0 ){
        sqlite3_result_error_nomem(context);
      }else{
        int i;
        char *z = zRet;
        for(i=0; i<p->nCol; i++){
          sqlite3_snprintf(24, z, "%llu ", (u64)aCnt[i]);
          z += sqlite3Strlen30(z);
        }
        assert( z[0]=='\0' && z>zRet );
        z[-1] = '\0';
        sqlite3_result_text(context, zRet, -1, sqlite3_free);
      }
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */
#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( argc );
#endif
}